

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint8_t uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  array_container_t *c;
  uint16_t *puVar4;
  bool bVar5;
  shared_container_t *psVar6;
  ulong uVar7;
  array_container_t *run;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ushort uVar17;
  ushort uVar18;
  uint8_t *typecode;
  uint uVar19;
  uint uVar20;
  shared_container_t *psVar21;
  ulong uVar22;
  ulong uVar23;
  shared_container_t *psVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  byte bVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  uint8_t local_59;
  
  if (min <= max) {
    iVar9 = (r->high_low_container).size;
    if (iVar9 == 0) {
      uVar11 = 0;
    }
    else {
      iVar9 = iVar9 + -1;
      uVar11 = 0;
      uVar12 = min;
      do {
        if (iVar9 < (int)uVar11) {
          uVar12 = ~uVar11;
          break;
        }
        uVar26 = uVar11 + iVar9 >> 1;
        uVar18 = *(ushort *)
                  ((long)(r->high_low_container).keys + (ulong)(uVar11 + iVar9 & 0xfffffffe));
        uVar17 = (ushort)(min >> 0x10);
        if (uVar18 < uVar17) {
          uVar11 = uVar26 + 1;
          bVar5 = true;
        }
        else if (uVar17 < uVar18) {
          iVar9 = uVar26 - 1;
          bVar5 = true;
        }
        else {
          bVar5 = false;
          uVar12 = uVar26;
        }
      } while (bVar5);
      uVar11 = (int)uVar12 >> 0x1f ^ uVar12;
    }
    uVar26 = (r->high_low_container).size;
    uVar29 = (ulong)uVar26;
    uVar20 = uVar11;
    if ((int)uVar11 < (int)uVar26) {
      uVar30 = max >> 0x10;
      uVar32 = (ulong)(int)uVar11;
      psVar21 = (shared_container_t *)(ulong)uVar11;
      uVar13 = uVar11;
      do {
        uVar20 = (uint)psVar21;
        uVar26 = (uint)uVar29;
        uVar18 = (r->high_low_container).keys[uVar32];
        uVar11 = (uint)uVar32;
        if (uVar30 < uVar18) break;
        uVar10 = 0;
        if (min >> 0x10 == (uint)uVar18) {
          uVar10 = min & 0xffff;
        }
        uVar29 = 0xffff;
        if (uVar30 == uVar18) {
          uVar29 = (ulong)(max & 0xffff);
        }
        if ((int)uVar26 <= (int)(uVar11 & 0xffff)) {
          __assert_fail("i < ra->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
        }
        uVar23 = uVar32 & 0xffff;
        typecode = (r->high_low_container).typecodes;
        psVar6 = (shared_container_t *)(r->high_low_container).containers[uVar23];
        psVar24 = psVar21;
        if (typecode[uVar23] == '\x04') {
          typecode = typecode + uVar23;
          psVar24 = psVar6;
          psVar6 = (shared_container_t *)shared_container_extract_copy(psVar6,typecode);
        }
        (r->high_low_container).containers[uVar23] = psVar6;
        run = (array_container_t *)(r->high_low_container).containers[uVar32];
        uVar1 = (r->high_low_container).typecodes[uVar32];
        uVar17 = (ushort)uVar29;
        uVar11 = (uint)uVar29;
        uVar18 = (ushort)uVar10;
        if (uVar1 == '\x03') {
          iVar9 = run->cardinality;
          lVar27 = (long)iVar9;
          if ((lVar27 == 0) ||
             ((prVar3 = (rle16_t *)run->array, uVar10 <= prVar3->value &&
              ((ushort)(prVar3[lVar27 + -1].length + prVar3[lVar27 + -1].value) <= uVar11)))) {
            run = (array_container_t *)0x0;
          }
          else {
            iVar14 = iVar9 + -1;
            uVar25 = 0;
            uVar26 = uVar30;
            iVar31 = iVar14;
            do {
              if (iVar31 < (int)uVar25) {
                uVar26 = ~uVar25;
                uVar25 = uVar26;
                break;
              }
              uVar15 = uVar25 + iVar31 >> 1;
              if ((ushort)(prVar3[uVar15].length + prVar3[uVar15].value) < uVar18) {
                uVar25 = uVar15 + 1;
                bVar5 = true;
              }
              else if (uVar18 < prVar3[uVar15].value) {
                iVar31 = uVar15 - 1;
                bVar5 = true;
              }
              else {
                bVar5 = false;
                uVar26 = uVar15;
              }
            } while (bVar5);
            uVar15 = 0;
            do {
              if (iVar14 < (int)uVar15) {
                uVar25 = ~uVar15;
                break;
              }
              uVar19 = uVar15 + iVar14 >> 1;
              if ((ushort)(prVar3[uVar19].length + prVar3[uVar19].value) < uVar17) {
                uVar15 = uVar19 + 1;
                bVar5 = true;
              }
              else if (uVar17 < prVar3[uVar19].value) {
                iVar14 = uVar19 - 1;
                bVar5 = true;
              }
              else {
                bVar5 = false;
                uVar25 = uVar19;
              }
            } while (bVar5);
            if ((int)uVar26 < 0) {
              uVar26 = ~uVar26;
LAB_00113031:
              if ((int)uVar25 < 0) {
                uVar25 = -uVar25 - 2;
              }
              else {
                uVar18 = prVar3[uVar25].length + prVar3[uVar25].value;
                if (uVar11 < uVar18) {
                  prVar3[uVar25].value = uVar17 + 1;
                  prVar3[uVar25].length = uVar18 - (uVar17 + 1);
                  uVar25 = uVar25 - 1;
                }
              }
              if ((int)uVar26 <= (int)uVar25) {
                iVar9 = iVar9 + ~uVar25;
                iVar31 = uVar26 + ~uVar25;
                if ((0 < iVar31) && (run->capacity < iVar31 + iVar9)) {
                  run_container_grow((run_container_t *)run,iVar31 + iVar9,true);
                }
                lVar27 = (long)run->cardinality - (long)iVar9;
                memmove((rle16_t *)run->array + ((int)lVar27 + iVar31),
                        (rle16_t *)run->array + lVar27,(long)iVar9 << 2);
                run->cardinality = run->cardinality + iVar31;
              }
            }
            else {
              uVar2 = prVar3[uVar26].value;
              if (uVar10 <= uVar2) goto LAB_00113031;
              if ((uint)prVar3[uVar26].length + (uint)uVar2 <= uVar11) {
                prVar3[uVar26].length = uVar18 + ~uVar2;
                uVar26 = uVar26 + 1;
                goto LAB_00113031;
              }
              if (run->capacity <= iVar9) {
                run_container_grow((run_container_t *)run,iVar9 + 1,true);
              }
              uVar29 = (long)(int)uVar26 + 1U & 0xffff;
              memmove((rle16_t *)run->array + uVar29 + 1,(rle16_t *)run->array + uVar29,
                      ((long)run->cardinality - uVar29) * 4);
              run->cardinality = run->cardinality + 1;
              prVar3 = (rle16_t *)run->array;
              uVar29 = (long)(int)uVar26 + 1U & 0xffffffff;
              prVar3[uVar29].value = uVar17 + 1;
              uVar2 = prVar3[uVar26].value;
              prVar3[uVar29].length = ~uVar17 + uVar2 + prVar3[uVar26].length;
              prVar3[uVar26].length = uVar18 + ~uVar2;
            }
            local_59 = '\x03';
            if (0x1ffe < run->cardinality * 4) {
              run = (array_container_t *)bitset_container_from_run((run_container_t *)run);
              local_59 = '\x01';
            }
          }
        }
        else if (uVar1 == '\x02') {
          prVar3 = (rle16_t *)run->array;
          uVar11 = run->cardinality;
          uVar10 = 0;
          uVar26 = 0;
          if (uVar11 != 0) {
            iVar9 = uVar11 - 1;
            uVar26 = 0;
            do {
              if (iVar9 < (int)uVar26) {
                uVar25 = ~uVar26;
                break;
              }
              uVar25 = uVar26 + iVar9 >> 1;
              uVar2 = *(ushort *)((long)&prVar3->value + (ulong)(uVar26 + iVar9 & 0xfffffffe));
              if (uVar2 < uVar17) {
                uVar26 = uVar25 + 1;
                bVar5 = true;
              }
              else if (uVar17 < uVar2) {
                iVar9 = uVar25 - 1;
                bVar5 = true;
              }
              else {
                bVar5 = false;
                typecode = (uint8_t *)(ulong)uVar25;
              }
              uVar25 = (uint)typecode;
            } while (bVar5);
            psVar24 = (shared_container_t *)(ulong)~uVar25;
            uVar26 = uVar25 + 1;
            if (-1 < (int)uVar25) {
              uVar26 = ~uVar25;
            }
            uVar26 = uVar26 + uVar11;
          }
          if (uVar11 != uVar26) {
            iVar9 = ~uVar26 + uVar11;
            uVar25 = 0;
            do {
              if (iVar9 < (int)uVar25) {
                uVar10 = ~uVar25;
                break;
              }
              uVar10 = uVar25 + iVar9 >> 1;
              psVar6 = (shared_container_t *)(ulong)uVar10;
              uVar17 = *(ushort *)((long)&prVar3->value + (ulong)(uVar25 + iVar9 & 0xfffffffe));
              if (uVar17 < uVar18) {
                uVar25 = uVar10 + 1;
                bVar5 = true;
                psVar6 = psVar24;
              }
              else if (uVar18 < uVar17) {
                iVar9 = uVar10 - 1;
                bVar5 = true;
                psVar6 = psVar24;
              }
              else {
                bVar5 = false;
              }
              uVar10 = (uint)psVar6;
              psVar24 = psVar6;
            } while (bVar5);
            uVar10 = (int)uVar10 >> 0x1f ^ uVar10;
          }
          if (uVar10 + uVar26 == 0) {
            run = (array_container_t *)0x0;
          }
          else {
            local_59 = '\x02';
            iVar9 = uVar11 - (uVar10 + uVar26);
            if (iVar9 != 0) {
              memmove(&prVar3->value + uVar10,&prVar3->value + (uVar10 + iVar9),(ulong)uVar26 * 2);
              run->cardinality = run->cardinality - iVar9;
            }
          }
        }
        else {
          prVar3 = (rle16_t *)run->array;
          uVar26 = uVar10 >> 6;
          uVar7 = (ulong)uVar26;
          uVar23 = uVar29 >> 6;
          uVar25 = (uint)uVar23;
          bVar8 = (byte)uVar10;
          bVar28 = (byte)uVar29;
          if (uVar25 == uVar26) {
            uVar29 = *(ulong *)(prVar3 + uVar7 * 2) &
                     (0xffffffffffffffffU >> (~bVar28 + bVar8 & 0x3f)) << (bVar8 & 0x3f);
            uVar29 = uVar29 - (uVar29 >> 1 & 0x5555555555555555);
            uVar29 = (uVar29 >> 2 & 0x3333333333333333) + (uVar29 & 0x3333333333333333);
            uVar15 = (uint)(byte)(((uVar29 >> 4) + uVar29 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                 >> 0x38);
          }
          else {
            uVar29 = (*(ulong *)(prVar3 + uVar7 * 2) >> (bVar8 & 0x3f)) << (bVar8 & 0x3f);
            uVar29 = uVar29 - (uVar29 >> 1 & 0x5555555555555555);
            uVar29 = (uVar29 >> 2 & 0x3333333333333333) + (uVar29 & 0x3333333333333333);
            uVar29 = ((uVar29 >> 4) + uVar29 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
            uVar16 = uVar29 >> 0x38;
            uVar15 = (uint)(byte)(uVar29 >> 0x38);
            if (uVar26 + 1 < uVar25) {
              uVar29 = (ulong)(uVar26 + 1);
              do {
                uVar22 = *(ulong *)(prVar3 + uVar29 * 2) -
                         (*(ulong *)(prVar3 + uVar29 * 2) >> 1 & 0x5555555555555555);
                uVar22 = (uVar22 >> 2 & 0x3333333333333333) + (uVar22 & 0x3333333333333333);
                uVar15 = (int)uVar16 +
                         (uint)(byte)(((uVar22 >> 4) + uVar22 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38);
                uVar16 = (ulong)uVar15;
                uVar29 = uVar29 + 1;
              } while (uVar23 != uVar29);
            }
            uVar29 = (ulong)(*(long *)(prVar3 + uVar23 * 2) << (~bVar28 & 0x3f)) >> (~bVar28 & 0x3f)
            ;
            uVar29 = uVar29 - (uVar29 >> 1 & 0x5555555555555555);
            uVar29 = (uVar29 >> 2 & 0x3333333333333333) + (uVar29 & 0x3333333333333333);
            uVar15 = (byte)(((uVar29 >> 4) + uVar29 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                           ) + uVar15;
          }
          iVar9 = run->cardinality - uVar15;
          if (iVar9 == 0) {
            run = (array_container_t *)0x0;
          }
          else if (iVar9 < 0x1000) {
            if (uVar11 + 1 != uVar10) {
              uVar29 = -1L << (bVar8 & 0x3f);
              if (uVar25 - uVar26 == 0) {
                uVar29 = (uVar29 << (~bVar28 & 0x3f)) >> (~bVar28 & 0x3f);
                uVar23 = (ulong)uVar26;
              }
              else {
                *(ulong *)(prVar3 + (ulong)uVar26 * 2) =
                     *(ulong *)(prVar3 + (ulong)uVar26 * 2) & ~uVar29;
                if (uVar26 + 1 < uVar25) {
                  memset(prVar3 + uVar7 * 2 + 2,0,(ulong)((uVar25 - uVar26) - 2) * 8 + 8);
                }
                uVar29 = 0xffffffffffffffff >> (~bVar28 & 0x3f);
              }
              *(ulong *)(prVar3 + uVar23 * 2) = *(ulong *)(prVar3 + uVar23 * 2) & ~uVar29;
            }
            run->cardinality = iVar9;
            run = array_container_from_bitset((bitset_container_t *)run);
            local_59 = '\x02';
          }
          else {
            if (uVar11 + 1 != uVar10) {
              uVar29 = -1L << (bVar8 & 0x3f);
              if (uVar25 - uVar26 == 0) {
                uVar29 = (uVar29 << (~bVar28 & 0x3f)) >> (~bVar28 & 0x3f);
                uVar23 = (ulong)uVar26;
              }
              else {
                *(ulong *)(prVar3 + (ulong)uVar26 * 2) =
                     *(ulong *)(prVar3 + (ulong)uVar26 * 2) & ~uVar29;
                if (uVar26 + 1 < uVar25) {
                  memset(prVar3 + uVar7 * 2 + 2,0,(ulong)((uVar25 - uVar26) - 2) * 8 + 8);
                }
                uVar29 = 0xffffffffffffffff >> (~bVar28 & 0x3f);
              }
              *(ulong *)(prVar3 + uVar23 * 2) = *(ulong *)(prVar3 + uVar23 * 2) & ~uVar29;
            }
            run->cardinality = iVar9;
            local_59 = '\x01';
          }
        }
        c = (array_container_t *)(r->high_low_container).containers[uVar32];
        if (run != c) {
          container_free(c,(r->high_low_container).typecodes[uVar32]);
        }
        if (run != (array_container_t *)0x0) {
          if ((r->high_low_container).size <= (int)uVar20) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a55,
                          "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                         );
          }
          puVar4 = (r->high_low_container).keys;
          puVar4[(int)uVar20] = puVar4[uVar32];
          (r->high_low_container).containers[(int)uVar20] = run;
          (r->high_low_container).typecodes[(int)uVar20] = local_59;
          psVar21 = (shared_container_t *)(ulong)(uVar20 + 1);
        }
        uVar20 = (uint)psVar21;
        uVar32 = uVar32 + 1;
        uVar11 = uVar13 + 1;
        uVar26 = (r->high_low_container).size;
        uVar29 = (ulong)(int)uVar26;
        uVar13 = uVar11;
      } while ((long)uVar32 < (long)uVar29);
    }
    if ((int)uVar20 < (int)uVar11) {
      ra_shift_tail(&r->high_low_container,uVar26 - uVar11,uVar20 - uVar11);
      return;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min = (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, src);
        container_t *new_container;
        uint8_t new_type;
        new_container = container_remove_range(ra->containers[src],
                                               ra->typecodes[src],
                                               container_min, container_max,
                                               &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src],
                           ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}